

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::add_assign_op<double,double>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,Matrix<double,__1,__1,_0,__1,__1> *src,
               add_assign_op<double,_double> *func)

{
  variable_if_dynamic<long,__1> func_00;
  Matrix<double,__1,__1,_0,__1,__1> *dstExpr;
  undefined1 local_70 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_30 [8];
  SrcEvaluatorType srcEvaluator;
  add_assign_op<double,_double> *func_local;
  Matrix<double,__1,__1,_0,__1,__1> *src_local;
  Matrix<double,__1,__1,_0,__1,__1> *dst_local;
  
  srcEvaluator.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.
  m_outerStride.m_value = (long)func;
  evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::evaluator
            ((evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_30,src);
  resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::add_assign_op<double,double>>
            (dst,src,(add_assign_op<double,_double> *)
                     srcEvaluator.
                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     .m_outerStride.m_value);
  evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::evaluator
            ((evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&kernel.m_dstExpr,dst);
  func_00 = srcEvaluator.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.
            m_outerStride;
  dstExpr = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::const_cast_derived
                      ((EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
              *)local_70,(DstEvaluatorType *)&kernel.m_dstExpr,(SrcEvaluatorType *)local_30,
             (add_assign_op<double,_double> *)func_00.m_value,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_3,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
         *)local_70);
  evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~evaluator
            ((evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&kernel.m_dstExpr);
  evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~evaluator
            ((evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_30);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);
    
  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}